

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O3

void __thiscall sf::Shader::~Shader(Shader *this)

{
  TransientContextLock lock;
  TransientContextLock local_9;
  
  GlResource::TransientContextLock::TransientContextLock(&local_9);
  if (this->m_shaderProgram != 0) {
    (*sf_glad_glDeleteObjectARB)(this->m_shaderProgram);
  }
  GlResource::TransientContextLock::~TransientContextLock(&local_9);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->m_uniforms)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_const_sf::Texture_*>,_std::_Select1st<std::pair<const_int,_const_sf::Texture_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_const_sf::Texture_*>_>_>
  ::~_Rb_tree(&(this->m_textures)._M_t);
  GlResource::~GlResource((GlResource *)this);
  return;
}

Assistant:

Shader::~Shader()
{
    TransientContextLock lock;

    // Destroy effect program
    if (m_shaderProgram)
        glCheck(GLEXT_glDeleteObject(castToGlHandle(m_shaderProgram)));
}